

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O2

void set_mode_eval_params(AV1_COMP *cpi,MACROBLOCK *x,MODE_EVAL_TYPE mode_eval_type)

{
  MB_RD_RECORD *pMVar1;
  ulong uVar2;
  TX_SIZE_SEARCH_METHOD TVar3;
  uint uVar4;
  int iVar5;
  TX_MODE TVar6;
  int iVar7;
  undefined7 in_register_00000011;
  long lVar8;
  bool bVar9;
  
  iVar7 = (int)CONCAT71(in_register_00000011,mode_eval_type);
  (x->txfm_search_params).use_qm_dist_metric =
       (uint)((cpi->oxcf).tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR);
  if (iVar7 == 2) {
    (x->txfm_search_params).use_default_intra_tx_type = 0;
    (x->txfm_search_params).default_inter_tx_type_prob_thresh = 0x7fffffff;
    (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[2];
    (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[2];
    set_tx_domain_dist_params
              (&cpi->winner_mode_params,&x->txfm_search_params,
               (cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist,1);
    uVar2 = (ulong)((cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0);
    (x->txfm_search_params).coeff_opt_thresholds[0] =
         (cpi->winner_mode_params).coeff_opt_thresholds[uVar2 * 2][0];
    (x->txfm_search_params).coeff_opt_thresholds[1] =
         (cpi->winner_mode_params).coeff_opt_thresholds[uVar2 * 2][1];
    TVar3 = (cpi->winner_mode_params).tx_size_search_methods[0];
    iVar5 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
    (x->txfm_search_params).tx_size_search_method = TVar3;
    if (iVar5 != 0) {
      TVar3 = (cpi->winner_mode_params).tx_size_search_methods[2];
      (x->txfm_search_params).tx_size_search_method = TVar3;
    }
    TVar6 = '\0';
    if ((cpi->common).features.coded_lossless == false) {
      TVar6 = '\x02' - (TVar3 == '\x02');
    }
    (x->txfm_search_params).tx_mode_search_type = TVar6;
    iVar5 = (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
    (x->txfm_search_params).prune_2d_txfm_mode =
         (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
    if (iVar5 == 0) goto LAB_009743f9;
    lVar8 = 1;
  }
  else {
    if ((cpi->sf).tx_sf.tx_type_search.fast_intra_tx_type_search == 0) {
      uVar4 = (uint)(cpi->oxcf).txfm_cfg.use_intra_default_tx_only;
    }
    else {
      uVar4 = 1;
    }
    (x->txfm_search_params).use_default_intra_tx_type = uVar4;
    (x->txfm_search_params).default_inter_tx_type_prob_thresh =
         (cpi->sf).tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh;
    (x->txfm_search_params).skip_txfm_level = (cpi->winner_mode_params).skip_txfm_level[1];
    (x->txfm_search_params).predict_dc_level = (cpi->winner_mode_params).predict_dc_level[1];
    lVar8 = 0;
    set_tx_domain_dist_params
              (&cpi->winner_mode_params,&x->txfm_search_params,
               (cpi->sf).winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist,0);
    bVar9 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_coeff_opt != 0;
    (x->txfm_search_params).coeff_opt_thresholds[0] =
         (cpi->winner_mode_params).coeff_opt_thresholds[bVar9][0];
    (x->txfm_search_params).coeff_opt_thresholds[1] =
         (cpi->winner_mode_params).coeff_opt_thresholds[bVar9][1];
    TVar3 = (cpi->winner_mode_params).tx_size_search_methods[0];
    iVar5 = (cpi->sf).winner_mode_sf.enable_winner_mode_for_tx_size_srch;
    (x->txfm_search_params).tx_size_search_method = TVar3;
    if (iVar5 != 0) {
      TVar3 = (cpi->winner_mode_params).tx_size_search_methods[1];
      (x->txfm_search_params).tx_size_search_method = TVar3;
    }
    TVar6 = '\x02' - (TVar3 == '\x02');
    if ((cpi->common).features.coded_lossless != false) {
      TVar6 = '\0';
    }
    (x->txfm_search_params).tx_mode_search_type = TVar6;
    iVar5 = (cpi->sf).tx_sf.tx_type_search.winner_mode_tx_type_pruning;
    (x->txfm_search_params).prune_2d_txfm_mode =
         (uint)(cpi->sf).tx_sf.tx_type_search.prune_2d_txfm_mode;
    if (iVar5 == 0) goto LAB_009743f9;
  }
  (x->txfm_search_params).prune_2d_txfm_mode = *(int *)(&DAT_00c0f338 + lVar8 * 4 + (long)iVar5 * 8)
  ;
LAB_009743f9:
  if (((x->txfm_search_params).mode_eval_type != iVar7) &&
     (pMVar1 = (x->txfm_search_info).mb_rd_record, pMVar1 != (MB_RD_RECORD *)0x0)) {
    pMVar1->index_start = 0;
    pMVar1->num = 0;
  }
  (x->txfm_search_params).mode_eval_type = iVar7;
  return;
}

Assistant:

static inline void set_mode_eval_params(const struct AV1_COMP *cpi,
                                        MACROBLOCK *x,
                                        MODE_EVAL_TYPE mode_eval_type) {
  const AV1_COMMON *cm = &cpi->common;
  const SPEED_FEATURES *sf = &cpi->sf;
  const WinnerModeParams *winner_mode_params = &cpi->winner_mode_params;
  TxfmSearchParams *txfm_params = &x->txfm_search_params;

  txfm_params->use_qm_dist_metric =
      cpi->oxcf.tune_cfg.dist_metric == AOM_DIST_METRIC_QM_PSNR;

  switch (mode_eval_type) {
    case DEFAULT_EVAL:
      txfm_params->default_inter_tx_type_prob_thresh = INT_MAX;
      txfm_params->use_default_intra_tx_type = 0;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[DEFAULT_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[DEFAULT_EVAL];
      // Set default transform domain distortion type
      set_tx_domain_dist_params(winner_mode_params, txfm_params, 0, 0);

      // Get default threshold for R-D optimization of coefficients
      get_rd_opt_coeff_thresh(winner_mode_params->coeff_opt_thresholds,
                              txfm_params, 0, 0);

      // Set default transform size search method
      set_tx_size_search_method(cm, winner_mode_params, txfm_params, 0, 0);
      // Set default transform type prune
      set_tx_type_prune(sf, txfm_params, 0, 0);
      break;
    case MODE_EVAL:
      txfm_params->use_default_intra_tx_type =
          (cpi->sf.tx_sf.tx_type_search.fast_intra_tx_type_search ||
           cpi->oxcf.txfm_cfg.use_intra_default_tx_only);
      txfm_params->default_inter_tx_type_prob_thresh =
          cpi->sf.tx_sf.tx_type_search.fast_inter_tx_type_prob_thresh;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[MODE_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[MODE_EVAL];
      // Set transform domain distortion type for mode evaluation
      set_tx_domain_dist_params(
          winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist, 0);

      // Get threshold for R-D optimization of coefficients during mode
      // evaluation
      get_rd_opt_coeff_thresh(
          winner_mode_params->coeff_opt_thresholds, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_coeff_opt, 0);

      // Set the transform size search method for mode evaluation
      set_tx_size_search_method(
          cm, winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch, 0);
      // Set transform type prune for mode evaluation
      set_tx_type_prune(sf, txfm_params,
                        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning,
                        0);
      break;
    case WINNER_MODE_EVAL:
      txfm_params->default_inter_tx_type_prob_thresh = INT_MAX;
      txfm_params->use_default_intra_tx_type = 0;
      txfm_params->skip_txfm_level =
          winner_mode_params->skip_txfm_level[WINNER_MODE_EVAL];
      txfm_params->predict_dc_level =
          winner_mode_params->predict_dc_level[WINNER_MODE_EVAL];

      // Set transform domain distortion type for winner mode evaluation
      set_tx_domain_dist_params(
          winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_use_tx_domain_dist, 1);

      // Get threshold for R-D optimization of coefficients for winner mode
      // evaluation
      get_rd_opt_coeff_thresh(
          winner_mode_params->coeff_opt_thresholds, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_coeff_opt, 1);

      // Set the transform size search method for winner mode evaluation
      set_tx_size_search_method(
          cm, winner_mode_params, txfm_params,
          sf->winner_mode_sf.enable_winner_mode_for_tx_size_srch, 1);
      // Set default transform type prune mode for winner mode evaluation
      set_tx_type_prune(sf, txfm_params,
                        sf->tx_sf.tx_type_search.winner_mode_tx_type_pruning,
                        1);
      break;
    default: assert(0);
  }

  // Rd record collected at a specific mode evaluation stage can not be used
  // across other evaluation stages as the transform parameters are different.
  // Hence, reset mb rd record whenever mode evaluation stage type changes.
  if (txfm_params->mode_eval_type != mode_eval_type)
    reset_mb_rd_record(x->txfm_search_info.mb_rd_record);

  txfm_params->mode_eval_type = mode_eval_type;
}